

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O1

_Bool borg_think_shop_sell(void)

{
  borg_item_conflict *pbVar1;
  wchar_t wVar2;
  ulong uVar3;
  char *what;
  long lVar4;
  borg_item_conflict *item;
  bool bVar5;
  bool bVar6;
  
  pbVar1 = borg_items;
  bVar5 = borg.goal.shop == shop_num;
  bVar6 = -1 < (int)borg.goal._30_4_;
  if (bVar6 && bVar5) {
    uVar3 = (ulong)(ushort)borg.goal.item;
    item = borg_items + uVar3;
    wVar2 = borg_min_item_quantity(item);
    what = format("# Selling %s",item);
    borg_note(what);
    borg_keypress(0x73);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[borg.goal.item]);
    if (1 < (uint)wVar2 || 1 < pbVar1[uVar3].iqty) {
      if ((uint)(wVar2 + L'\xfffffffe') < 4) {
        borg_keypress(wVar2 | 0x30);
      }
      borg_keypress(0x9c);
    }
    if (borg.goal.shop != 7) {
      borg_keypress(0x9c);
      borg_keypress(0xe000);
      borg_keypress(0xe000);
      borg_keypress(0xe000);
    }
    if (L'\b' < sold_item_nxt) {
      sold_item_nxt = L'\0';
    }
    lVar4 = (long)sold_item_nxt;
    sold_item_pval[lVar4] = (int)item->pval;
    sold_item_tval[lVar4] = (uint)item->tval;
    sold_item_sval[lVar4] = (uint)item->sval;
    sold_item_store[lVar4] = (int)borg.goal.shop;
    sold_item_num = sold_item_nxt;
    sold_item_nxt = sold_item_nxt + L'\x01';
    borg.goal.ware = -1;
    borg.goal.item = -1;
    borg.goal.shop = -1;
    borg.time_this_panel = borg.time_this_panel + 1;
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg.in_shop = false;
    borg_do_inven = true;
  }
  return bVar6 && bVar5;
}

Assistant:

bool borg_think_shop_sell(void)
{
    int qty = 1;

    /* Sell something if requested */
    if ((borg.goal.shop == shop_num) && (borg.goal.item >= 0)) {
        borg_item *item = &borg_items[borg.goal.item];

        qty             = borg_min_item_quantity(item);

        /* Log */
        borg_note(format("# Selling %s", item->desc));

        /* Sell an item */
        borg_keypress('s');

        /* Sell the desired item */
        borg_keypress(all_letters_nohjkl[borg.goal.item]);

        /* Hack -- Sell a single item */
        if (item->iqty > 1 || qty >= 2) {
            if (qty == 5)
                borg_keypress('5');
            if (qty == 4)
                borg_keypress('4');
            if (qty == 3)
                borg_keypress('3');
            if (qty == 2)
                borg_keypress('2');
            borg_keypress(KC_ENTER);
        }

        /* Mega-Hack -- Accept the price */
        if (borg.goal.shop != BORG_HOME) {
            borg_keypress(KC_ENTER);
            borg_keypress(ESCAPE);
            borg_keypress(ESCAPE);
            borg_keypress(ESCAPE);
        }

        /* Mark our last item sold */
        if (sold_item_nxt >= 9)
            sold_item_nxt = 0;
        sold_item_pval[sold_item_nxt]  = item->pval;
        sold_item_tval[sold_item_nxt]  = item->tval;
        sold_item_sval[sold_item_nxt]  = item->sval;
        sold_item_store[sold_item_nxt] = borg.goal.shop;
        sold_item_num                  = sold_item_nxt;
        sold_item_nxt++;

        /* The purchase is complete */
        borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

        /* tick the anti-loop clock */
        borg.time_this_panel++;

        /* I'm not in a store */
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg.in_shop  = false;
        borg_do_inven = true;
        /* Success */
        return true;
    }

    /* Nope */
    return false;
}